

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-test.cc
# Opt level: O1

void __thiscall ExprTest_InvalidCallArg_Test::TestBody(ExprTest_InvalidCallArg_Test *this)

{
  ExprFactory *this_00;
  bool bVar1;
  Function func;
  char *message;
  StringRef name;
  CallExprBuilder CVar2;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  AssertHelper AStack_68;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_60 [2];
  long local_50 [2];
  AssertionResult local_40;
  BasicIteratedExprBuilder<mp::CallExpr> local_30;
  
  this_00 = &(this->super_ExprTest).factory_;
  local_60[0].ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::vector<mp::Function::Impl_const*,std::allocator<mp::Function::Impl_const*>>::
  emplace_back<mp::Function::Impl_const*>
            ((vector<mp::Function::Impl_const*,std::allocator<mp::Function::Impl_const*>> *)
             &(this->super_ExprTest).factory_.funcs_,(Impl **)local_60);
  name.size_ = 3;
  name.data_ = "foo";
  func = mp::BasicExprFactory<std::allocator<char>_>::CreateFunction
                   (this_00,(this->super_ExprTest).factory_.funcs_.
                            super__Vector_base<const_mp::Function::Impl_*,_std::allocator<const_mp::Function::Impl_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish + -1,name,1,NUMERIC);
  CVar2 = mp::BasicExprFactory<std::allocator<char>_>::BeginCall(this_00,func,1);
  local_30.impl_ = CVar2.impl_;
  local_30.arg_index_ = CVar2.arg_index_;
  testing::AssertionSuccess();
  if (local_40.success_ == true) {
    local_60[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"invalid argument","");
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      mp::BasicExprFactory<std::allocator<char>_>::BasicIteratedExprBuilder<mp::CallExpr>::AddArg
                (&local_30,(Arg)0x0);
    }
    testing::AssertionResult::operator<<
              (&local_40,
               (char (*) [115])
               "Expected: builder.AddArg(NumericExpr()) throws an exception of type AssertionFailure.\n  Actual: it throws nothing."
              );
    if (local_60[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50) {
      operator_delete(local_60[0].ptr_,local_50[0] + 1);
    }
  }
  testing::Message::Message((Message *)local_60);
  if (local_40.message_.ptr_ ==
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    message = "";
  }
  else {
    message = ((local_40.message_.ptr_)->_M_dataplus)._M_p;
  }
  testing::internal::AssertHelper::AssertHelper
            (&AStack_68,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/test/expr-test.cc",0x153,
             message);
  testing::internal::AssertHelper::operator=(&AStack_68,(Message *)local_60);
  testing::internal::AssertHelper::~AssertHelper(&AStack_68);
  if (local_60[0].ptr_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) &&
       (local_60[0].ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
      (**(code **)(*(long *)local_60[0].ptr_ + 8))();
    }
    local_60[0].ptr_ =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_40.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  return;
}

Assistant:

TEST_F(ExprTest, InvalidCallArg) {
  mp::Function f = factory_.AddFunction("foo", 1);
  auto builder = factory_.BeginCall(f, 1);
  EXPECT_ASSERT(builder.AddArg(NumericExpr()), "invalid argument");
}